

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShader.cpp
# Opt level: O2

void __thiscall
rsg::ShaderInput::ShaderInput(ShaderInput *this,Variable *variable,ConstValueRangeAccess valueRange)

{
  int iVar1;
  StridedValueRead<1> local_48;
  StridedValueAccess<1> local_38;
  
  this->m_variable = variable;
  iVar1 = VariableType::getScalarSize(&variable->m_type);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::vector
            (&this->m_min,(long)iVar1,(allocator_type *)&local_48);
  iVar1 = VariableType::getScalarSize(&variable->m_type);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::vector
            (&this->m_max,(long)iVar1,(allocator_type *)&local_48);
  local_48.m_type = valueRange.m_type;
  local_48.m_value = valueRange.m_min;
  local_38.super_ConstStridedValueAccess<1>.m_value =
       (this->m_min).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_38.super_ConstStridedValueAccess<1>.m_type = &variable->m_type;
  StridedValueAccess<1>::operator=(&local_38,&local_48);
  local_48.m_type = valueRange.m_type;
  local_48.m_value = valueRange.m_max;
  local_38.super_ConstStridedValueAccess<1>.m_value =
       (this->m_max).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_38.super_ConstStridedValueAccess<1>.m_type = &variable->m_type;
  StridedValueAccess<1>::operator=(&local_38,&local_48);
  return;
}

Assistant:

ShaderInput::ShaderInput (const Variable* variable, ConstValueRangeAccess valueRange)
	: m_variable	(variable)
	, m_min			(variable->getType().getScalarSize())
	, m_max			(variable->getType().getScalarSize())
{
	ValueAccess(variable->getType(), &m_min[0]) = valueRange.getMin().value();
	ValueAccess(variable->getType(), &m_max[0]) = valueRange.getMax().value();
}